

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool el::Configurations::Parser::isLevel(string *line)

{
  bool bVar1;
  string *in_RDI;
  string *str;
  allocator local_29;
  string local_28 [40];
  
  str = (string *)el::base::consts::kConfigurationLevel;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,(char *)str,&local_29);
  bVar1 = el::base::utils::Str::startsWith(str,in_RDI);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return bVar1;
}

Assistant:

bool Configurations::Parser::isLevel(const std::string& line) {
  return base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLevel));
}